

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmyblas2.c
# Opt level: O2

void cusolve(int ldm,int ncol,singlecomplex *M,singlecomplex *rhs)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  float *pfVar5;
  int iVar6;
  singlecomplex sVar7;
  singlecomplex xj;
  singlecomplex local_38;
  
  lVar4 = (long)ncol;
  iVar6 = 0;
  iVar2 = 0;
  if (0 < ncol) {
    iVar2 = ncol;
  }
  pfVar5 = &M[(lVar4 + -1) * (long)ldm].i;
  for (; iVar6 != iVar2; iVar6 = iVar6 + 1) {
    lVar4 = lVar4 + -1;
    c_div(&local_38,rhs + lVar4,M + lVar4 + (int)lVar4 * ldm);
    rhs[lVar4] = local_38;
    uVar1 = (uint)DAT_0010f710;
    for (lVar3 = 0; lVar3 < lVar4; lVar3 = lVar3 + 1) {
      sVar7.r = rhs[lVar3].r -
                (pfVar5[lVar3 * 2 + -1] * local_38.r +
                pfVar5[lVar3 * 2] * (float)((uint)local_38.i ^ uVar1));
      sVar7.i = rhs[lVar3].i -
                (pfVar5[lVar3 * 2 + -1] * local_38.i + pfVar5[lVar3 * 2] * local_38.r);
      rhs[lVar3] = sVar7;
    }
    pfVar5 = pfVar5 + (long)ldm * -2;
  }
  return;
}

Assistant:

void cusolve (int ldm, int ncol, singlecomplex *M, singlecomplex *rhs)
{
    singlecomplex xj, temp;
    int jcol, j, irow;

    jcol = ncol - 1;

    for (j = 0; j < ncol; j++) {

	c_div(&xj, &rhs[jcol], &M[jcol + jcol*ldm]); /* M(jcol, jcol) */
	rhs[jcol] = xj;
	
	for (irow = 0; irow < jcol; irow++) {
	    cc_mult(&temp, &xj, &M[irow+jcol*ldm]); /* M(irow, jcol) */
	    c_sub(&rhs[irow], &rhs[irow], &temp);
	}

	jcol--;

    }
}